

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform_subquery.cpp
# Opt level: O0

void duckdb::RemoveOrderQualificationRecursive
               (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                *expr)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  iVar1;
  ExpressionType EVar2;
  BaseExpression *this;
  size_type sVar3;
  reference pvVar4;
  function<void_(duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_&)>
  *in_stack_000000e8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  *col_names;
  ColumnRefExpression *col_ref;
  allocator_type *in_stack_fffffffffffffef8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  *in_stack_ffffffffffffff00;
  iterator in_stack_ffffffffffffff08;
  function<void_(duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_&)>
  *in_stack_ffffffffffffff10;
  BaseExpression *in_stack_ffffffffffffff40;
  string *psVar5;
  string *local_b8;
  anon_class_1_0_00000001 local_98 [48];
  string *local_68;
  string local_60 [32];
  string *local_40;
  undefined8 local_38;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  *local_18;
  ColumnRefExpression *local_10;
  
  this = &unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
          ::operator->((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                        *)in_stack_ffffffffffffff00)->super_BaseExpression;
  EVar2 = BaseExpression::GetExpressionType(this);
  if (EVar2 == COLUMN_REF) {
    unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>::
    operator->((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                *)in_stack_ffffffffffffff00);
    local_10 = BaseExpression::Cast<duckdb::ColumnRefExpression>(in_stack_ffffffffffffff40);
    local_18 = &local_10->column_names;
    sVar3 = ::std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_18);
    if (1 < sVar3) {
      local_68 = local_60;
      pvVar4 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
               ::back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                       *)in_stack_ffffffffffffff40);
      ::std::__cxx11::string::string(local_60,(string *)pvVar4);
      local_40 = local_60;
      local_38 = 1;
      ::std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)0x1a1aa7a);
      iVar1._M_len = (size_type)in_stack_ffffffffffffff10;
      iVar1._M_array = in_stack_ffffffffffffff08;
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
      ::vector(in_stack_ffffffffffffff00,iVar1,in_stack_fffffffffffffef8);
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
      ::operator=(in_stack_ffffffffffffff00,
                  (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                   *)in_stack_fffffffffffffef8);
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                 *)0x1a1aac0);
      ::std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)0x1a1aacd);
      psVar5 = local_60;
      local_b8 = (string *)&local_40;
      do {
        local_b8 = local_b8 + -0x20;
        ::std::__cxx11::string::~string(local_b8);
      } while (local_b8 != psVar5);
    }
  }
  else {
    unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>::
    operator*((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
               *)in_stack_ffffffffffffff00);
    ::std::
    function<void(duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>&)>
    ::
    function<duckdb::RemoveOrderQualificationRecursive(duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>&)::__0,void>
              (in_stack_ffffffffffffff10,local_98);
    ParsedExpressionIterator::EnumerateChildren((ParsedExpression *)col_names,in_stack_000000e8);
    ::std::
    function<void_(duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_&)>
    ::~function((function<void_(duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_&)>
                 *)0x1a1ac0f);
  }
  return;
}

Assistant:

void RemoveOrderQualificationRecursive(unique_ptr<ParsedExpression> &expr) {
	if (expr->GetExpressionType() == ExpressionType::COLUMN_REF) {
		auto &col_ref = expr->Cast<ColumnRefExpression>();
		auto &col_names = col_ref.column_names;
		if (col_names.size() > 1) {
			col_names = vector<string> {col_names.back()};
		}
	} else {
		ParsedExpressionIterator::EnumerateChildren(
		    *expr, [](unique_ptr<ParsedExpression> &child) { RemoveOrderQualificationRecursive(child); });
	}
}